

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O0

int XMLSearch_search_add_attribute
              (XMLSearch *search,SXML_CHAR *attr_name,SXML_CHAR *attr_value,int value_equal)

{
  char *__ptr;
  XMLAttribute *pXVar1;
  char *local_50;
  SXML_CHAR *value;
  SXML_CHAR *name;
  XMLAttribute *pt;
  int i;
  int value_equal_local;
  SXML_CHAR *attr_value_local;
  SXML_CHAR *attr_name_local;
  XMLSearch *search_local;
  
  if (search == (XMLSearch *)0x0) {
    search_local._4_4_ = -1;
  }
  else if ((attr_name == (SXML_CHAR *)0x0) || (*attr_name == '\0')) {
    search_local._4_4_ = -1;
  }
  else {
    __ptr = strdup(attr_name);
    if (attr_value == (SXML_CHAR *)0x0) {
      local_50 = (char *)0x0;
    }
    else {
      local_50 = strdup(attr_value);
    }
    if ((__ptr == (char *)0x0) || ((attr_value != (SXML_CHAR *)0x0 && (local_50 == (char *)0x0)))) {
      if (local_50 != (char *)0x0) {
        free(local_50);
      }
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
    }
    search_local._4_4_ = search->n_attributes;
    pXVar1 = (XMLAttribute *)realloc(search->attributes,(long)(search_local._4_4_ + 1) * 0x18);
    if (pXVar1 == (XMLAttribute *)0x0) {
      if (local_50 != (char *)0x0) {
        free(local_50);
      }
      free(__ptr);
      search_local._4_4_ = -1;
    }
    else {
      pXVar1[search_local._4_4_].name = __ptr;
      pXVar1[search_local._4_4_].value = local_50;
      pXVar1[search_local._4_4_].active = value_equal;
      search->n_attributes = search_local._4_4_ + 1;
      search->attributes = pXVar1;
    }
  }
  return search_local._4_4_;
}

Assistant:

int XMLSearch_search_add_attribute(XMLSearch* search, const SXML_CHAR* attr_name, const SXML_CHAR* attr_value, int value_equal)
{
	int i;
	XMLAttribute* pt;
	SXML_CHAR* name;
	SXML_CHAR* value;

	if (search == NULL)
		return -1;

	if (attr_name == NULL || attr_name[0] == NULC)
		return -1;

	name = sx_strdup(attr_name);
	value = (attr_value == NULL ? NULL : sx_strdup(attr_value));
	if (name == NULL || (attr_value && value == NULL)) {
		if (value != NULL)
			__free(value);
		if (name != NULL)
			__free(name);
	}

	i = search->n_attributes;
	pt = (XMLAttribute*)__realloc(search->attributes, (i + 1) * sizeof(XMLAttribute));
	if (pt == NULL) {
		if (value)
			__free(value);
		__free(name);
		return -1;
	}

	pt[i].name = name;
	pt[i].value = value;
	pt[i].active = value_equal;

	search->n_attributes = i+1;
	search->attributes = pt;

	return i;
}